

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::DynamicMessageFactory::DynamicMessageFactory(DynamicMessageFactory *this)

{
  PrototypeMap *this_00;
  DynamicMessageFactory *this_local;
  
  MessageFactory::MessageFactory(&this->super_MessageFactory);
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_006fab40;
  this->pool_ = (DescriptorPool *)0x0;
  this->delegate_to_generated_factory_ = false;
  this_00 = (PrototypeMap *)operator_new(0x38);
  PrototypeMap::PrototypeMap(this_00);
  internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::scoped_ptr
            (&this->prototypes_,this_00);
  internal::Mutex::Mutex(&this->prototypes_mutex_);
  return;
}

Assistant:

DynamicMessageFactory::DynamicMessageFactory()
  : pool_(NULL), delegate_to_generated_factory_(false),
    prototypes_(new PrototypeMap) {
}